

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O3

void process_data_context_main
               (j_decompress_ptr cinfo,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
               JDIMENSION out_rows_avail)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  jpeg_d_main_controller *pjVar4;
  jpeg_d_main_controller *pjVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  jpeg_component_info *pjVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  pjVar4 = cinfo->main;
  if (*(int *)&pjVar4[6].start_pass == 0) {
    iVar9 = (*cinfo->coef->decompress_data)
                      (cinfo,(JSAMPIMAGE)(&pjVar4[6].process_data)[*(int *)&pjVar4[7].process_data])
    ;
    if (iVar9 == 0) {
      return;
    }
    *(undefined4 *)&pjVar4[6].start_pass = 1;
    piVar2 = (int *)((long)&pjVar4[8].start_pass + 4);
    *piVar2 = *piVar2 + 1;
  }
  iVar9 = *(int *)((long)&pjVar4[7].process_data + 4);
  if (iVar9 != 0) {
    if (iVar9 == 1) goto LAB_00108a46;
    if (iVar9 != 2) {
      return;
    }
    (*cinfo->post->post_process_data)
              (cinfo,(JSAMPIMAGE)(&pjVar4[6].process_data)[*(int *)&pjVar4[7].process_data],
               (JDIMENSION *)((long)&pjVar4[6].start_pass + 4),*(JDIMENSION *)&pjVar4[8].start_pass,
               output_buf,out_row_ctr,out_rows_avail);
    if (*(uint *)((long)&pjVar4[6].start_pass + 4) < *(uint *)&pjVar4[8].start_pass) {
      return;
    }
    *(undefined4 *)((long)&pjVar4[7].process_data + 4) = 0;
    if (out_rows_avail <= *out_row_ctr) {
      return;
    }
  }
  *(undefined4 *)((long)&pjVar4[6].start_pass + 4) = 0;
  iVar9 = cinfo->min_DCT_v_scaled_size;
  *(int *)&pjVar4[8].start_pass = iVar9 + -1;
  auVar8 = _DAT_0011a5b0;
  auVar7 = _DAT_0011a5a0;
  if ((*(JDIMENSION *)((long)&pjVar4[8].start_pass + 4) == cinfo->total_iMCU_rows) &&
     (iVar3 = cinfo->num_components, 0 < (long)iVar3)) {
    pjVar18 = cinfo->comp_info;
    pjVar5 = cinfo->main;
    iVar10 = *(int *)&pjVar5[7].process_data;
    lVar20 = 0;
    do {
      uVar15 = pjVar18->DCT_v_scaled_size * pjVar18->v_samp_factor;
      iVar11 = (int)uVar15 / iVar9;
      uVar14 = pjVar18->downsampled_height % uVar15;
      if (uVar14 != 0) {
        uVar15 = uVar14;
      }
      if (lVar20 == 0) {
        *(int *)&pjVar5[8].start_pass = (int)(uVar15 - 1) / iVar11 + 1;
      }
      if (0 < iVar11) {
        lVar1 = *(long *)((&pjVar5[6].process_data)[iVar10] + lVar20 * 8) + (long)(int)uVar15 * 8;
        uVar6 = *(undefined8 *)(lVar1 + -8);
        uVar12 = (ulong)(uint)(iVar11 * 2);
        if (iVar11 * 2 < 2) {
          uVar12 = 1;
        }
        lVar13 = uVar12 - 1;
        auVar21._8_4_ = (int)lVar13;
        auVar21._0_8_ = lVar13;
        auVar21._12_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar21 = auVar21 ^ auVar8;
        lVar13 = 0;
        auVar22 = auVar7;
        do {
          auVar23 = auVar22 ^ auVar8;
          if ((bool)(~(auVar21._4_4_ < auVar23._4_4_ ||
                      auVar21._0_4_ < auVar23._0_4_ && auVar23._4_4_ == auVar21._4_4_) & 1)) {
            *(undefined8 *)(lVar1 + lVar13) = uVar6;
          }
          if (auVar23._12_4_ <= auVar21._12_4_ &&
              (auVar23._8_4_ <= auVar21._8_4_ || auVar23._12_4_ != auVar21._12_4_)) {
            *(undefined8 *)(lVar1 + 8 + lVar13) = uVar6;
          }
          lVar16 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 2;
          auVar22._8_8_ = lVar16 + 2;
          lVar13 = lVar13 + 0x10;
        } while ((ulong)((int)uVar12 + 1U & 0xfffffffe) << 3 != lVar13);
      }
      lVar20 = lVar20 + 1;
      pjVar18 = pjVar18 + 1;
    } while (lVar20 != iVar3);
  }
  *(undefined4 *)((long)&pjVar4[7].process_data + 4) = 1;
LAB_00108a46:
  (*cinfo->post->post_process_data)
            (cinfo,(JSAMPIMAGE)(&pjVar4[6].process_data)[*(int *)&pjVar4[7].process_data],
             (JDIMENSION *)((long)&pjVar4[6].start_pass + 4),*(JDIMENSION *)&pjVar4[8].start_pass,
             output_buf,out_row_ctr,out_rows_avail);
  if (*(uint *)&pjVar4[8].start_pass <= *(uint *)((long)&pjVar4[6].start_pass + 4)) {
    iVar9 = cinfo->min_DCT_v_scaled_size;
    if ((*(int *)((long)&pjVar4[8].start_pass + 4) == 1) &&
       (iVar3 = cinfo->num_components, 0 < (long)iVar3)) {
      pjVar18 = cinfo->comp_info;
      pjVar5 = cinfo->main;
      lVar20 = 0;
      do {
        uVar12 = (long)(pjVar18->DCT_v_scaled_size * pjVar18->v_samp_factor) / (long)iVar9;
        iVar10 = (int)uVar12;
        if (0 < iVar10) {
          lVar1 = *(long *)(pjVar5[6].process_data + lVar20 * 8);
          lVar13 = *(long *)(pjVar5[7].start_pass + lVar20 * 8);
          lVar16 = (long)(iVar10 * (iVar9 + 1));
          uVar12 = uVar12 & 0xffffffff;
          lVar19 = (long)(iVar10 * (iVar9 + 2));
          lVar17 = 0;
          do {
            *(undefined8 *)(lVar1 + uVar12 * -8 + lVar17) =
                 *(undefined8 *)(lVar1 + lVar16 * 8 + lVar17);
            *(undefined8 *)(lVar13 + uVar12 * -8 + lVar17) =
                 *(undefined8 *)(lVar13 + lVar16 * 8 + lVar17);
            *(undefined8 *)(lVar1 + lVar19 * 8 + lVar17) = *(undefined8 *)(lVar1 + lVar17);
            *(undefined8 *)(lVar13 + lVar19 * 8 + lVar17) = *(undefined8 *)(lVar13 + lVar17);
            lVar17 = lVar17 + 8;
          } while (uVar12 * 8 != lVar17);
        }
        lVar20 = lVar20 + 1;
        pjVar18 = pjVar18 + 1;
      } while (lVar20 != iVar3);
    }
    *(byte *)&pjVar4[7].process_data = *(byte *)&pjVar4[7].process_data ^ 1;
    *(undefined4 *)&pjVar4[6].start_pass = 0;
    *(int *)((long)&pjVar4[6].start_pass + 4) = iVar9 + 1;
    *(int *)&pjVar4[8].start_pass = iVar9 + 2;
    *(undefined4 *)((long)&pjVar4[7].process_data + 4) = 2;
  }
  return;
}

Assistant:

METHODDEF(void)
process_data_context_main (j_decompress_ptr cinfo,
			   JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
			   JDIMENSION out_rows_avail)
{
  my_main_ptr main = (my_main_ptr) cinfo->main;

  /* Read input data if we haven't filled the main buffer yet */
  if (! main->buffer_full) {
    if (! (*cinfo->coef->decompress_data) (cinfo,
					   main->xbuffer[main->whichptr]))
      return;			/* suspension forced, can do nothing more */
    main->buffer_full = TRUE;	/* OK, we have an iMCU row to work with */
    main->iMCU_row_ctr++;	/* count rows received */
  }

  /* Postprocessor typically will not swallow all the input data it is handed
   * in one call (due to filling the output buffer first).  Must be prepared
   * to exit and restart.  This switch lets us keep track of how far we got.
   * Note that each case falls through to the next on successful completion.
   */
  switch (main->context_state) {
  case CTX_POSTPONED_ROW:
    /* Call postprocessor using previously set pointers for postponed row */
    (*cinfo->post->post_process_data) (cinfo, main->xbuffer[main->whichptr],
			&main->rowgroup_ctr, main->rowgroups_avail,
			output_buf, out_row_ctr, out_rows_avail);
    if (main->rowgroup_ctr < main->rowgroups_avail)
      return;			/* Need to suspend */
    main->context_state = CTX_PREPARE_FOR_IMCU;
    if (*out_row_ctr >= out_rows_avail)
      return;			/* Postprocessor exactly filled output buf */
    /*FALLTHROUGH*/
  case CTX_PREPARE_FOR_IMCU:
    /* Prepare to process first M-1 row groups of this iMCU row */
    main->rowgroup_ctr = 0;
    main->rowgroups_avail = (JDIMENSION) (cinfo->min_DCT_v_scaled_size - 1);
    /* Check for bottom of image: if so, tweak pointers to "duplicate"
     * the last sample row, and adjust rowgroups_avail to ignore padding rows.
     */
    if (main->iMCU_row_ctr == cinfo->total_iMCU_rows)
      set_bottom_pointers(cinfo);
    main->context_state = CTX_PROCESS_IMCU;
    /*FALLTHROUGH*/
  case CTX_PROCESS_IMCU:
    /* Call postprocessor using previously set pointers */
    (*cinfo->post->post_process_data) (cinfo, main->xbuffer[main->whichptr],
			&main->rowgroup_ctr, main->rowgroups_avail,
			output_buf, out_row_ctr, out_rows_avail);
    if (main->rowgroup_ctr < main->rowgroups_avail)
      return;			/* Need to suspend */
    /* After the first iMCU, change wraparound pointers to normal state */
    if (main->iMCU_row_ctr == 1)
      set_wraparound_pointers(cinfo);
    /* Prepare to load new iMCU row using other xbuffer list */
    main->whichptr ^= 1;	/* 0=>1 or 1=>0 */
    main->buffer_full = FALSE;
    /* Still need to process last row group of this iMCU row, */
    /* which is saved at index M+1 of the other xbuffer */
    main->rowgroup_ctr = (JDIMENSION) (cinfo->min_DCT_v_scaled_size + 1);
    main->rowgroups_avail = (JDIMENSION) (cinfo->min_DCT_v_scaled_size + 2);
    main->context_state = CTX_POSTPONED_ROW;
  }
}